

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O0

_Bool adjust_order_ops_depth_block(borg_calculation *f,int pdepth,int start,int end)

{
  token_type *ptVar1;
  bool bVar2;
  _Bool _Var3;
  token_type tVar4;
  borg_array *a;
  token_type *item;
  int local_68;
  int count_at_level;
  _Bool higher;
  token *token;
  int l [4];
  int local_40;
  int local_3c;
  int lvl;
  int j;
  int i;
  int tok;
  operator_struct *o;
  borg_array *operators;
  int end_local;
  int start_local;
  int pdepth_local;
  borg_calculation *f_local;
  
  a = (borg_array *)mem_zalloc(0x10);
  memset(&token,0,0x10);
  for (j = start; j < end; j = j + 1) {
    ptVar1 = (token_type *)f->token_array->items[j];
    if ((ptVar1[4] == pdepth) && (_Var3 = is_operator(*ptVar1), _Var3)) {
      item = (token_type *)mem_alloc(0xc);
      *item = *ptVar1;
      tVar4 = operation_level(*ptVar1);
      item[1] = tVar4;
      item[2] = j;
      l[(long)(int)item[1] + -2] = l[(long)(int)item[1] + -2] + 1;
      borg_array_add(a,item);
    }
  }
  if (1 < a->count) {
    local_68 = 0;
    for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
      if (l[(long)local_40 + -2] != 0) {
        for (lvl = 0; lvl < a->count; lvl = lvl + 1) {
          if (*(int *)((long)a->items[lvl] + 4) == local_40) {
            bVar2 = false;
            local_3c = local_40;
            do {
              local_3c = local_3c + 1;
              if (3 < local_3c) goto LAB_002a7c90;
            } while (l[(long)local_3c + -2] == 0);
            bVar2 = true;
LAB_002a7c90:
            if ((bVar2) || (local_68 < a->count + -1)) {
              add_depth(f,*(int *)((long)a->items[lvl] + 8));
              local_68 = local_68 + 1;
            }
          }
        }
      }
    }
  }
  for (lvl = 0; lvl < a->count; lvl = lvl + 1) {
    mem_free(a->items[lvl]);
    a->items[lvl] = (void *)0x0;
  }
  mem_free(a);
  return false;
}

Assistant:

static bool adjust_order_ops_depth_block(
    struct borg_calculation *f, int pdepth, int start, int end)
{
    struct operator_struct {
        enum token_type type;
        int             level;
        int             position;
    };
    struct borg_array      *operators = mem_zalloc(sizeof(struct borg_array));
    struct operator_struct *o;
    int                     tok;
    int                     i, j;
    int                     lvl;
    int                     l[4] = { 0, 0, 0, 0 };

    for (tok = start; tok < end; tok++) {
        struct token *token = f->token_array->items[tok];
        if (token->pdepth != pdepth)
            continue;
        if (is_operator(token->type)) {
            o           = mem_alloc(sizeof(struct operator_struct));
            o->type     = token->type;
            o->level    = operation_level(token->type);
            o->position = tok;
            l[o->level]++;
            borg_array_add(operators, o);
        }
    }

    /* find groups at the same level so the formula */
    /* 1 + 2 * (3 + 4 * 5) + 6 + 7 */
    /* already has things at two levels */
    /* "1 + 2 *" is at one level "3 + 4 * 5" is deeper (done first) and */
    /* "+ 6 + 7" is back at the first level.  */
    /* it grabs the groups and the adds depth (as if they were parenthesized) */
    /* to higher operations levels.  so it grabs 1 + 2 * (deeper) and */
    /* calculates "*" is first so it makes it as if it was 1 + (2 * (deeper)) */
    /* by pushing the 2 and the "(deeper)" down.  Repeat until all levels are */
    /* handled */
    bool higher;
    if (operators->count > 1) {
        int count_at_level = 0;
        for (lvl = 0; lvl < OP_LEVELS; lvl++) {
            if (l[lvl]) {
                for (i = 0; i < operators->count; i++) {
                    o = operators->items[i];
                    if (o->level == lvl) {
                        /* if there is an at higher level or this isn't the last
                         */
                        /* the last check is for a*b*c needs to be (a*b)*c */
                        higher = false;
                        for (j = lvl + 1; j < OP_LEVELS; j++)
                            if (l[j]) {
                                higher = true;
                                break;
                            }
                        if (higher || count_at_level < (operators->count - 1)) {
                            add_depth(f, o->position);
                            count_at_level++;
                        }
                    }
                }
            }
        }
    }

    /* free up the temporary memory */
    for (i = 0; i < operators->count; i++) {
        mem_free(operators->items[i]);
        operators->items[i] = NULL;
    }
    mem_free(operators);
    operators = NULL;

    return false;
}